

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseRefKind(WastParser *this,Type *out_type)

{
  TokenType TVar1;
  Result RVar2;
  long *plVar3;
  long lVar4;
  Type type;
  Token token;
  Type local_d0;
  string local_c8;
  size_t local_a8;
  char *pcStack_a0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_98;
  undefined8 uStack_90;
  undefined1 local_80 [32];
  char **local_60;
  undefined1 local_58 [24];
  long *local_40 [2];
  long local_30 [2];
  
  TVar1 = Peek(this,0);
  if (2 < TVar1 - First_RefKind) {
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"func","");
    local_60 = &(((anon_union_24_4_98baf137_for_Token_2 *)local_58)->text_)._M_str;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"extern","");
    plVar3 = local_30;
    local_40[0] = plVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"exn","");
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
               (string *)local_80,&stack0xffffffffffffffe0);
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_c8,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c8);
    lVar4 = -0x60;
    do {
      if (plVar3 != (long *)plVar3[-2]) {
        operator_delete((long *)plVar3[-2],*plVar3 + 1);
      }
      plVar3 = plVar3 + -4;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0);
    return (Result)RVar2.enum_;
  }
  Consume((Token *)local_80,this);
  if (((TokenType)local_60 & ~AssertExhaustion) != First_Type) {
    __assert_fail("HasType()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/token.h"
                  ,0x68,"Type wabt::Token::type() const");
  }
  local_d0.enum_ = local_58._0_4_;
  local_d0.type_index_ = local_58._4_4_;
  if ((uint)((Enum)local_58._0_8_ + 0x22) < 2) {
    if ((this->options_->features).gc_enabled_ == false) {
LAB_0012fa1e:
      local_98.offset = local_80._16_8_;
      uStack_90 = local_80._24_8_;
      local_a8 = local_80._0_8_;
      pcStack_a0 = (char *)local_80._8_8_;
      Type::GetName_abi_cxx11_(&local_c8,&local_d0);
      Error(this,0x168d63,local_c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      return (Result)Error;
    }
  }
  else if (((Enum)local_58._0_8_ == ExternRef) &&
          ((this->options_->features).reference_types_enabled_ != true)) goto LAB_0012fa1e;
  out_type->enum_ = local_58._0_4_;
  out_type->type_index_ = local_58._4_4_;
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseRefKind(Type* out_type) {
  WABT_TRACE(ParseRefKind);
  if (!IsTokenTypeRefKind(Peek())) {
    return ErrorExpected({"func", "extern", "exn"});
  }

  Token token = Consume();
  Type type = token.type();

  if ((type == Type::ExternRef &&
       !options_->features.reference_types_enabled()) ||
      ((type == Type::Struct || type == Type::Array) &&
       !options_->features.gc_enabled())) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}